

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.c
# Opt level: O1

Value * apply_check_not_equality_operation(Value *left_value,Value *right_value)

{
  ValueType VVar1;
  longlong lVar2;
  longlong lVar3;
  Value *pVVar4;
  bool bVar5;
  longdouble lVar6;
  longdouble lVar7;
  
  VVar1 = left_value->value_type;
  if ((VVar1 == ValueTypeIntegerValue) && (right_value->value_type == ValueTypeIntegerValue)) {
    bVar5 = *(long *)(left_value + 1) == *(long *)(right_value + 1);
  }
  else {
    if (((VVar1 & ~ValueTypeBoolValue) == ValueTypeIntegerValue) &&
       ((right_value->value_type & ~ValueTypeBoolValue) == ValueTypeIntegerValue)) {
      if (VVar1 == ValueTypeFloatValue) {
        lVar6 = *(longdouble *)&left_value[1].linked_variable_count;
      }
      else {
        lVar6 = (longdouble)*(long *)(left_value + 1);
      }
      if (right_value->value_type == ValueTypeFloatValue) {
        lVar7 = *(longdouble *)&right_value[1].linked_variable_count;
      }
      else {
        lVar7 = (longdouble)*(long *)(right_value + 1);
      }
      bVar5 = lVar6 != lVar7;
      goto LAB_0010807a;
    }
    if ((VVar1 == ValueTypeStringValue) &&
       (bVar5 = true, right_value->value_type == ValueTypeStringValue)) goto LAB_0010807a;
    lVar2 = convert_to_integer(left_value);
    lVar3 = convert_to_integer(right_value);
    bVar5 = lVar2 == lVar3;
  }
  bVar5 = !bVar5;
LAB_0010807a:
  pVVar4 = new_bool_value(bVar5);
  return pVVar4;
}

Assistant:

Value *apply_check_not_equality_operation(Value *left_value, Value *right_value) {
  if (left_value->value_type == ValueTypeIntegerValue && right_value->value_type == ValueTypeIntegerValue) {
    return new_bool_value(((IntegerValue *) left_value)->integer_value != ((IntegerValue *) right_value)->integer_value);
  }
  else if ((left_value->value_type == ValueTypeIntegerValue || left_value->value_type == ValueTypeFloatValue) && (right_value->value_type == ValueTypeIntegerValue || right_value->value_type == ValueTypeFloatValue)) {
    long double left_float, right_float;

    if (left_value->value_type == ValueTypeFloatValue) left_float = ((FloatValue *) left_value)->float_value;
    else left_float = ((IntegerValue *) left_value)->integer_value;

    if (right_value->value_type == ValueTypeFloatValue) right_float = ((FloatValue *) right_value)->float_value;
    else right_float = ((IntegerValue *) right_value)->integer_value;

    return new_bool_value(left_float != right_float);
  }
  else if (left_value->value_type == ValueTypeStringValue  && right_value->value_type == ValueTypeStringValue) {
    return new_bool_value(strcmp(((StringValue *) left_value)->string_value, ((StringValue *) left_value)->string_value) == 0);
  }

  return new_bool_value(convert_to_integer(left_value) != convert_to_integer(right_value));
}